

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PositionMeasurementModel.hpp
# Opt level: O2

void __thiscall
KalmanExamples::Robot1::PositionMeasurementModel<float,_Kalman::StandardBase>::updateJacobians
          (PositionMeasurementModel<float,_Kalman::StandardBase> *this,S *x)

{
  ResScalar RVar1;
  float fVar2;
  float fVar3;
  undefined4 *local_78;
  Vector<float,_2> *local_70;
  undefined4 local_44;
  undefined4 local_40;
  Vector<float,_2> position;
  Vector<float,_2> delta1;
  Vector<float,_2> delta2;
  
  Eigen::DenseBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>::setZero
            ((DenseBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_> *)
             &(this->
              super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
              ).H);
  Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::head<2>
            ((Type *)&local_78,(DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)x,2);
  local_44 = *local_78;
  local_40 = local_78[1];
  local_70 = &this->landmark1;
  local_78 = &local_44;
  Eigen::PlainObjectBase<Eigen::Matrix<float,2,1,0,2,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,2,1,0,2,1>const,Eigen::Matrix<float,2,1,0,2,1>const>>
            ((PlainObjectBase<Eigen::Matrix<float,2,1,0,2,1>> *)&position,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
              *)&local_78);
  local_70 = &this->landmark2;
  local_78 = &local_44;
  Eigen::PlainObjectBase<Eigen::Matrix<float,2,1,0,2,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,2,1,0,2,1>const,Eigen::Matrix<float,2,1,0,2,1>const>>
            ((PlainObjectBase<Eigen::Matrix<float,2,1,0,2,1>> *)&delta1,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
              *)&local_78);
  RVar1 = Eigen::internal::
          dot_nocheck<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_Eigen::Matrix<float,_2,_1,_0,_2,_1>,_false>
          ::run((MatrixBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *)&position,
                (MatrixBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *)&position);
  if (RVar1 < 0.0) {
    fVar2 = sqrtf(RVar1);
  }
  else {
    fVar2 = SQRT(RVar1);
  }
  RVar1 = Eigen::internal::
          dot_nocheck<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_Eigen::Matrix<float,_2,_1,_0,_2,_1>,_false>
          ::run((MatrixBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *)&delta1,
                (MatrixBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *)&delta1);
  if (RVar1 < 0.0) {
    fVar3 = sqrtf(RVar1);
  }
  else {
    fVar3 = SQRT(RVar1);
  }
  (this->
  super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
  ).H.super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.m_storage.m_data.array[0] =
       position.super_Matrix<float,_2,_1>.
       super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] / fVar2
  ;
  (this->
  super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
  ).H.super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.m_storage.m_data.array[2] =
       position.super_Matrix<float,_2,_1>.
       super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] / fVar2
  ;
  (this->
  super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
  ).H.super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.m_storage.m_data.array[1] =
       delta1.super_Matrix<float,_2,_1>.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
       m_storage.m_data.array[0] / fVar3;
  (this->
  super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
  ).H.super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.m_storage.m_data.array[3] =
       delta1.super_Matrix<float,_2,_1>.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
       m_storage.m_data.array[1] / fVar3;
  return;
}

Assistant:

void updateJacobians( const S& x )
    {
        // H = dh/dx (Jacobian of measurement function w.r.t. the state)
        this->H.setZero();
        
        // Robot position as (x,y)-vector
        // This uses the Eigen template method to get the first 2 elements of the vector
        Kalman::Vector<T, 2> position = x.template head<2>();
        
        // Distance of robot to landmark 1
        Kalman::Vector<T, 2> delta1 = position - landmark1;
        
        // Distance of robot to landmark 2
        Kalman::Vector<T, 2> delta2 = position - landmark2;
        
        // Distances
        T d1 = std::sqrt( delta1.dot(delta1) );
        T d2 = std::sqrt( delta2.dot(delta2) );
        
        // partial derivative of meas.d1() w.r.t. x.x()
        this->H( M::D1, S::X ) = delta1[0] / d1;
        // partial derivative of meas.d1() w.r.t. x.y()
        this->H( M::D1, S::Y ) = delta1[1] / d1;
        
        // partial derivative of meas.d1() w.r.t. x.x()
        this->H( M::D2, S::X ) = delta2[0] / d2;
        // partial derivative of meas.d1() w.r.t. x.y()
        this->H( M::D2, S::Y ) = delta2[1] / d2;
    }